

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

void close_state(lua_State *L)

{
  global_State *pgVar1;
  
  pgVar1 = L->l_G;
  if (((pgVar1->nilvalue).tt_ & 0xf) == 0) {
    L->ci = &L->base_ci;
    luaD_closeprotected(L,1,0);
  }
  luaC_freeallobjects(L);
  luaM_free_(L,(L->l_G->strt).hash,(long)(L->l_G->strt).size << 3);
  freestack(L);
  (*pgVar1->frealloc)(pgVar1->ud,&L[-1].hookmask,0x658,0);
  return;
}

Assistant:

static void close_state (lua_State *L) {
  global_State *g = G(L);
  if (!completestate(g))  /* closing a partially built state? */
    luaC_freeallobjects(L);  /* just collect its objects */
  else {  /* closing a fully built state */
    L->ci = &L->base_ci;  /* unwind CallInfo list */
    luaD_closeprotected(L, 1, LUA_OK);  /* close all upvalues */
    luaC_freeallobjects(L);  /* collect all objects */
    luai_userstateclose(L);
  }
  luaM_freearray(L, G(L)->strt.hash, G(L)->strt.size);
  freestack(L);
  lua_assert(gettotalbytes(g) == sizeof(LG));
  (*g->frealloc)(g->ud, fromstate(L), sizeof(LG), 0);  /* free main block */
}